

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

bool vkt::shaderexecutor::contains<tcu::Matrix<float,2,3>>(IVal *ival,Matrix<float,_2,_3> *value)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  Vector<float,_2> *value_00;
  Vector<tcu::Interval,_2> *ival_00;
  
  bVar2 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                    ((IVal *)ival,(Vector<float,_2> *)value);
  if (bVar2) {
    ival_00 = (ival->m_data).m_data;
    value_00 = (value->m_data).m_data;
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      ival_00 = ival_00 + 1;
      value_00 = value_00 + 1;
      if (uVar3 == 2) break;
      bVar2 = ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doContains
                        (ival_00,value_00);
      uVar1 = uVar3 + 1;
    } while (bVar2);
    bVar2 = 1 < uVar3;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}